

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

CURLcode Curl_socket(Curl_easy *data,Curl_addrinfo *ai,Curl_sockaddr_ex *addr,curl_socket_t *sockfd)

{
  anon_enum_32 aVar1;
  uint uVar2;
  connectdata *pcVar3;
  curl_socket_t cVar4;
  Curl_sockaddr_ex *pCVar5;
  int iVar6;
  int iVar7;
  curl_socket_t *pcVar8;
  CURLcode CVar9;
  int __type;
  Curl_sockaddr_ex *pCVar10;
  int one;
  Curl_sockaddr_ex dummy;
  undefined4 local_d4;
  connectdata *local_d0;
  curl_socket_t *local_c8;
  Curl_sockaddr_ex local_c0;
  
  local_d0 = data->conn;
  pCVar10 = addr;
  if (addr == (Curl_sockaddr_ex *)0x0) {
    pCVar10 = &local_c0;
  }
  iVar6 = ai->ai_family;
  pCVar10->family = iVar6;
  aVar1 = local_d0->transport;
  __type = (aVar1 != TRNSPRT_TCP) + 1;
  pCVar10->socktype = __type;
  iVar7 = 0x11;
  if (aVar1 == TRNSPRT_TCP) {
    iVar7 = ai->ai_protocol;
  }
  pCVar5 = addr;
  if (addr == (Curl_sockaddr_ex *)0x0) {
    pCVar5 = &local_c0;
  }
  pCVar5->protocol = iVar7;
  uVar2 = 0x80;
  if (ai->ai_addrlen < 0x80) {
    uVar2 = ai->ai_addrlen;
  }
  pCVar5->addrlen = uVar2;
  local_c8 = sockfd;
  memcpy(&pCVar5->_sa_ex_u,ai->ai_addr,(ulong)uVar2);
  if ((data->set).fopensocket == (curl_opensocket_callback)0x0) {
    cVar4 = socket(iVar6,__type,iVar7);
    *local_c8 = cVar4;
    pcVar8 = local_c8;
  }
  else {
    Curl_set_in_callback(data,true);
    cVar4 = (*(data->set).fopensocket)
                      ((data->set).opensocket_client,CURLSOCKTYPE_IPCXN,(curl_sockaddr *)pCVar10);
    pcVar8 = local_c8;
    *local_c8 = cVar4;
    Curl_set_in_callback(data,false);
    cVar4 = *pcVar8;
  }
  pcVar3 = local_d0;
  if (cVar4 == -1) {
    CVar9 = CURLE_COULDNT_CONNECT;
  }
  else {
    if (local_d0->transport == TRNSPRT_QUIC) {
      curlx_nonblock(cVar4,1);
    }
    if ((pcVar3->scope_id != 0) && (pCVar10->family == 10)) {
      pCVar5 = &local_c0;
      if (addr != (Curl_sockaddr_ex *)0x0) {
        pCVar5 = addr;
      }
      *(uint *)((long)&pCVar5->_sa_ex_u + 0x18) = pcVar3->scope_id;
    }
    CVar9 = CURLE_OK;
    if (pCVar10->socktype == 2) {
      local_d4 = 1;
      if (pCVar10->family == 10) {
        cVar4 = *pcVar8;
        iVar7 = 0x29;
        iVar6 = 0x19;
      }
      else {
        if (pCVar10->family != 2) {
          return CURLE_OK;
        }
        cVar4 = *pcVar8;
        iVar7 = 0;
        iVar6 = 0xb;
      }
      setsockopt(cVar4,iVar7,iVar6,&local_d4,4);
    }
  }
  return CVar9;
}

Assistant:

CURLcode Curl_socket(struct Curl_easy *data,
                     const struct Curl_addrinfo *ai,
                     struct Curl_sockaddr_ex *addr,
                     curl_socket_t *sockfd)
{
  struct connectdata *conn = data->conn;
  struct Curl_sockaddr_ex dummy;

  if(!addr)
    /* if the caller doesn't want info back, use a local temp copy */
    addr = &dummy;

  /*
   * The Curl_sockaddr_ex structure is basically libcurl's external API
   * curl_sockaddr structure with enough space available to directly hold
   * any protocol-specific address structures. The variable declared here
   * will be used to pass / receive data to/from the fopensocket callback
   * if this has been set, before that, it is initialized from parameters.
   */

  addr->family = ai->ai_family;
  addr->socktype = (conn->transport == TRNSPRT_TCP) ? SOCK_STREAM : SOCK_DGRAM;
  addr->protocol = conn->transport != TRNSPRT_TCP ? IPPROTO_UDP :
    ai->ai_protocol;
  addr->addrlen = ai->ai_addrlen;

  if(addr->addrlen > sizeof(struct Curl_sockaddr_storage))
     addr->addrlen = sizeof(struct Curl_sockaddr_storage);
  memcpy(&addr->sa_addr, ai->ai_addr, addr->addrlen);

  if(data->set.fopensocket) {
   /*
    * If the opensocket callback is set, all the destination address
    * information is passed to the callback. Depending on this information the
    * callback may opt to abort the connection, this is indicated returning
    * CURL_SOCKET_BAD; otherwise it will return a not-connected socket. When
    * the callback returns a valid socket the destination address information
    * might have been changed and this 'new' address will actually be used
    * here to connect.
    */
    Curl_set_in_callback(data, true);
    *sockfd = data->set.fopensocket(data->set.opensocket_client,
                                    CURLSOCKTYPE_IPCXN,
                                    (struct curl_sockaddr *)addr);
    Curl_set_in_callback(data, false);
  }
  else
    /* opensocket callback not set, so simply create the socket now */
    *sockfd = socket(addr->family, addr->socktype, addr->protocol);

  if(*sockfd == CURL_SOCKET_BAD)
    /* no socket, no connection */
    return CURLE_COULDNT_CONNECT;

  if(conn->transport == TRNSPRT_QUIC) {
    /* QUIC sockets need to be nonblocking */
    (void)curlx_nonblock(*sockfd, TRUE);
  }

#if defined(ENABLE_IPV6) && defined(HAVE_SOCKADDR_IN6_SIN6_SCOPE_ID)
  if(conn->scope_id && (addr->family == AF_INET6)) {
    struct sockaddr_in6 * const sa6 = (void *)&addr->sa_addr;
    sa6->sin6_scope_id = conn->scope_id;
  }
#endif

#if defined(__linux__) && defined(IP_RECVERR)
  if(addr->socktype == SOCK_DGRAM) {
    int one = 1;
    switch(addr->family) {
    case AF_INET:
      (void)setsockopt(*sockfd, SOL_IP, IP_RECVERR, &one, sizeof(one));
      break;
    case AF_INET6:
      (void)setsockopt(*sockfd, SOL_IPV6, IPV6_RECVERR, &one, sizeof(one));
      break;
    }
  }
#endif

  return CURLE_OK;
}